

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreateDefaultBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,bool null_const_for_phi_is_needed,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands,uint32_t merge_block_id)

{
  IRContext *this_00;
  iterator __position;
  uint32_t type_id;
  BasicBlock *parent_block;
  Instruction *pIVar1;
  uint32_t uVar2;
  undefined7 in_register_00000031;
  uint local_2c;
  
  parent_block = CreateNewBlock(this);
  AddBranchToBlock(this,parent_block,merge_block_id);
  if ((int)CONCAT71(in_register_00000031,null_const_for_phi_is_needed) != 0) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    pIVar1 = analysis::DefUseManager::GetDef
                       ((this_00->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,
                        *(phi_operands->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start);
    uVar2 = 0;
    type_id = 0;
    if (pIVar1->has_type_id_ == true) {
      type_id = Instruction::GetSingleWordOperand(pIVar1,0);
    }
    pIVar1 = GetConstNull(this,type_id);
    if (pIVar1->has_result_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    __position._M_current =
         (phi_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (phi_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_2c = uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (phi_operands,__position,&local_2c);
    }
    else {
      *__position._M_current = uVar2;
      (phi_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return parent_block;
}

Assistant:

BasicBlock* ReplaceDescArrayAccessUsingVarIndex::CreateDefaultBlock(
    bool null_const_for_phi_is_needed, std::vector<uint32_t>* phi_operands,
    uint32_t merge_block_id) const {
  auto* default_block = CreateNewBlock();
  AddBranchToBlock(default_block, merge_block_id);
  if (!null_const_for_phi_is_needed) return default_block;

  // Create null value for OpPhi
  Instruction* inst = context()->get_def_use_mgr()->GetDef((*phi_operands)[0]);
  auto* null_const_inst = GetConstNull(inst->type_id());
  phi_operands->push_back(null_const_inst->result_id());
  return default_block;
}